

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  vector<Word,_std::allocator<Word>_> program;
  Assembler assembler;
  VM vm;
  ifstream ifs;
  vector<Word,_std::allocator<Word>_> local_2a8;
  Assembler local_290;
  VM local_288;
  vector<Word,_std::allocator<Word>_> local_250;
  vector<Word,_std::allocator<Word>_> local_238;
  long local_220 [4];
  int aiStack_200 [122];
  
  std::ifstream::ifstream(local_220);
  if (argc == 2) {
    std::ifstream::open((char *)local_220,(_Ios_Openmode)argv[1]);
    if (*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unable to open file",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
      std::ostream::put('8');
      iVar1 = 1;
      std::ostream::flush();
      goto LAB_0010d887;
    }
    local_290._sourceStream = (istream *)local_220;
    Assembler::compile(&local_2a8,&local_290);
    VM::VM(&local_288);
    std::vector<Word,_std::allocator<Word>_>::vector(&local_250,&local_2a8);
    VM::load(&local_288,&local_250);
    if (local_250.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    VM::run(&local_288);
  }
  else {
    iVar1 = 0;
    if (argc != 1) goto LAB_0010d887;
    std::ifstream::open((char *)local_220,0x10f639);
    if (*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) != 0) {
      __assert_fail("ifs.good()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cubuspl42[P]aghsm/main.cpp"
                    ,0xc,"int main(int, char **)");
    }
    local_290._sourceStream = (istream *)local_220;
    Assembler::compile(&local_2a8,&local_290);
    VM::VM(&local_288);
    std::vector<Word,_std::allocator<Word>_>::vector(&local_238,&local_2a8);
    VM::load(&local_288,&local_238);
    if (local_238.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    VM::run(&local_288);
  }
  if (local_288._program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288._program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar1 = 0;
  if (local_2a8.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a8.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0010d887:
  std::ifstream::~ifstream(local_220);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
	std::ifstream ifs;

	if (argc == 1) {
		ifs.open("1.asm");
		assert(ifs.good());

		Assembler assembler(ifs);
		auto program = assembler.compile();
		VM vm;
		vm.load(program);
		vm.run();
	} else if (argc == 2) {
		ifs.open(argv[1]);
		
		if (!ifs.good()) {
			std::cerr << "Unable to open file" << std::endl;
			return 1;
		}

		try {
			Assembler assembler(ifs);
			auto program = assembler.compile();
			VM vm;
			vm.load(program);
			vm.run();
		} catch (std::exception &e) {
			std::cerr << e.what() << std::endl;
			return 1;
		}
	}

    return 0;
}